

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.h
# Opt level: O0

char * __thiscall
btPoint2PointConstraint::serialize
          (btPoint2PointConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  long in_RSI;
  long in_RDI;
  btSerializer *unaff_retaddr;
  btPoint2PointConstraintFloatData *p2pData;
  
  btTypedConstraint::serialize((btTypedConstraint *)serializer,p2pData,unaff_retaddr);
  btVector3::serialize((btVector3 *)(in_RDI + 0x144),(btVector3FloatData *)(in_RSI + 0x40));
  btVector3::serialize((btVector3 *)(in_RDI + 0x154),(btVector3FloatData *)(in_RSI + 0x50));
  return "btPoint2PointConstraintFloatData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btPoint2PointConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btPoint2PointConstraintData2* p2pData = (btPoint2PointConstraintData2*)dataBuffer;

	btTypedConstraint::serialize(&p2pData->m_typeConstraintData,serializer);
	m_pivotInA.serialize(p2pData->m_pivotInA);
	m_pivotInB.serialize(p2pData->m_pivotInB);

	return btPoint2PointConstraintDataName;
}